

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::PrepareProgram
          (StorageMultisampleTest *this,GLchar *variable_declaration,GLchar *tail)

{
  ostringstream *poVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  int *piVar9;
  undefined4 *puVar10;
  MessageBuilder *pMVar11;
  int *piVar12;
  bool bVar13;
  char **value;
  GLint status_1;
  GLint status;
  GLint log_size;
  GLint log_size_1;
  GLchar *log_text_1;
  int local_244;
  undefined8 local_240;
  int local_234;
  StorageMultisampleTest *local_230;
  undefined8 local_228;
  Enum<int,_2UL> local_220;
  bool *local_210;
  char *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  int local_1e8 [2];
  char *local_1e0;
  GLchar *local_1d8;
  GLchar *local_1d0;
  undefined8 local_1c8;
  int local_1c0 [4];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  local_230 = this;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  piVar12 = local_1e8;
  local_208 = s_vertex_shader;
  local_200 = 0;
  uStack_1f8 = 0;
  local_1f0 = 0x8b3100000001;
  local_1e8[0] = 0;
  local_1e0 = s_fragment_shader_head;
  local_1c8 = 0x8b3000000003;
  local_1c0[0] = 0;
  local_1d8 = variable_declaration;
  local_1d0 = tail;
  GVar5 = (**(code **)(lVar8 + 0x3c8))();
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xec8);
  value = &local_208;
  bVar3 = true;
  do {
    bVar13 = bVar3;
    uVar7 = (**(code **)(lVar8 + 0x3f0))(*(undefined4 *)((long)value + 0x1c));
    *(undefined4 *)(value + 4) = uVar7;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xed1);
    (**(code **)(lVar8 + 0x10))(GVar5,*(undefined4 *)(value + 4));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glAttachShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xed5);
    (**(code **)(lVar8 + 0x12b8))(*(undefined4 *)(value + 4),*(undefined4 *)(value + 3),value,0);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glShaderSource call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xed9);
    (**(code **)(lVar8 + 0x248))(*(undefined4 *)(value + 4));
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCompileShader call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xedd);
    local_244 = 0;
    (**(code **)(lVar8 + 0xa70))(*(undefined4 *)(value + 4),0x8b81,&local_244);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetShaderiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0xee2);
    if (local_244 == 0) {
      local_234 = 0;
      (**(code **)(lVar8 + 0xa70))(*(undefined4 *)(value + 4),0x8b84);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0xee8);
      iVar4 = local_234;
      local_240 = (char *)operator_new__((long)local_234);
      (**(code **)(lVar8 + 0xa58))(*(undefined4 *)(value + 4),iVar4,0,local_240);
      local_1b0._0_8_ = ((local_230->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Shader compilation has failed.\n",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Shader type: ",0xd);
      local_220.m_value = *(int *)((long)value + 0x1c);
      local_220.m_getName = glu::getShaderTypeName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_220,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Shader compilation error log:\n",0x1e);
      pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_240);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                 "Shader source code:\n",0x14);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,value);
      local_228 = (bool *)value[1];
      if (local_228 == (bool *)0x0) {
        local_228 = ::glcts::fixed_sample_locations_values + 1;
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char **)&local_228);
      local_210 = ::glcts::fixed_sample_locations_values + 1;
      if ((bool *)value[2] != (bool *)0x0) {
        local_210 = (bool *)value[2];
      }
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_210);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      if (local_240 != (char *)0x0) {
        operator_delete__(local_240);
      }
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetShaderInfoLog call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0xefa);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    value = &local_1e0;
    bVar3 = false;
  } while (bVar13);
  (**(code **)(lVar8 + 0xce8))(GVar5);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glTransformFeedbackVaryings call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf04);
  local_240 = (char *)((ulong)local_240._4_4_ << 0x20);
  (**(code **)(lVar8 + 0x9d8))(GVar5,0x8b82);
  if ((int)local_240 == 1) {
    piVar9 = piVar12;
    bVar3 = true;
    do {
      bVar13 = bVar3;
      if (*piVar9 != 0) {
        (**(code **)(lVar8 + 0x4e0))(GVar5);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glDetachShader call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0xf12);
      }
      piVar9 = local_1c0;
      bVar3 = false;
    } while (bVar13);
    bVar3 = true;
    do {
      bVar13 = bVar3;
      if (*piVar12 != 0) {
        (**(code **)(lVar8 + 0x470))();
        *piVar12 = 0;
      }
      piVar12 = local_1c0;
      bVar3 = false;
    } while (bVar13);
    if (GVar5 != 0) {
      return GVar5;
    }
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0;
    __cxa_throw(puVar10,&int::typeinfo,0);
  }
  local_228 = (bool *)((ulong)local_228._4_4_ << 0x20);
  (**(code **)(lVar8 + 0x9d8))(GVar5,0x8b84);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf1c);
  pcVar2 = local_228;
  local_220.m_getName = (GetNameFunc)operator_new__((long)(int)local_228);
  (**(code **)(lVar8 + 0x988))(GVar5,(ulong)pcVar2 & 0xffffffff,0,local_220.m_getName);
  local_1b0._0_8_ = ((local_230->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Program linkage has failed due to:\n",0x23);
  pMVar11 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(char **)&local_220);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_220.m_getName != (GetNameFunc)0x0) {
    operator_delete__(local_220.m_getName);
  }
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glGetProgramInfoLog call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xf28);
  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar10 = 0;
  __cxa_throw(puVar10,&int::typeinfo,0);
}

Assistant:

glw::GLuint StorageMultisampleTest::PrepareProgram(const glw::GLchar* variable_declaration, const glw::GLchar* tail)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	struct Shader
	{
		glw::GLchar const* source[3];
		glw::GLsizei const count;
		glw::GLenum const  type;
		glw::GLuint		   id;
	} shader[] = { { { s_vertex_shader, NULL, NULL }, 1, GL_VERTEX_SHADER, 0 },
				   { { s_fragment_shader_head, variable_declaration, tail }, 3, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	glw::GLuint po = 0;

	try
	{
		/* Create program. */
		po = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(po, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, shader[i].count, shader[i].source, NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source[0] << (shader[i].source[1] ? shader[i].source[1] : "")
						<< (shader[i].source[2] ? shader[i].source[2] : "") << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(po);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(po, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(po, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(po, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(po, log_size, NULL, &log_text[0]);

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Program linkage has failed due to:\n"
												<< log_text << "\n"
												<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (po)
		{
			gl.deleteProgram(po);

			po = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	if (0 == po)
	{
		throw 0;
	}

	return po;
}